

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void av1_update_film_grain_parameters(AV1_COMP *cpi,AV1EncoderConfig *oxcf)

{
  aom_film_grain_table_t *t;
  void *pvVar1;
  long in_RSI;
  aom_internal_error_info *in_RDI;
  char *unaff_retaddr;
  TuneCfg *tune_cfg;
  AV1_COMMON *cm;
  char *num;
  
  num = in_RDI[0x24e].detail + 0xb8;
  t = (aom_film_grain_table_t *)(in_RSI + 0x368);
  if (in_RDI[0x60b].jmp[0].__jmpbuf[5] != 0) {
    aom_film_grain_table_free(t);
    aom_free(t);
    in_RDI[0x60b].jmp[0].__jmpbuf[5] = 0;
  }
  if (*(int *)&t[1].tail == 0) {
    if (t->tail == (aom_film_grain_table_entry_t *)0x0) {
      if (*(int *)((long)&t[1].head + 4) == 2) {
        *(undefined4 *)(num + 0x5f40) = *(undefined4 *)(*(long *)(num + 0x6088) + 0x48);
        if ((*(byte *)(in_RSI + 0x124) & 1) != 0) {
          reset_film_grain_chroma_params((aom_film_grain_t *)0x2334bc);
        }
        if (*(int *)(*(long *)(num + 0x6088) + 0x5c) == 1) {
          num[0x5f3c] = '\0';
          num[0x5f3d] = '\0';
          num[0x5f3e] = '\0';
          num[0x5f3f] = '\0';
        }
      }
      else {
        memset(num + 0x5cc8,0,0x288);
      }
    }
    else {
      pvVar1 = aom_calloc((size_t)num,(size_t)t);
      in_RDI[0x60b].jmp[0].__jmpbuf[5] = (long)pvVar1;
      if (in_RDI[0x60b].jmp[0].__jmpbuf[5] == 0) {
        aom_internal_error(*(aom_internal_error_info **)(num + 0x30),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->film_grain_table");
      }
      aom_film_grain_table_read((aom_film_grain_table_t *)tune_cfg,unaff_retaddr,in_RDI);
    }
  }
  else if (*num == '\0') {
    memcpy(num + 0x5cc8,&PTR_pthread_attr_init_00c8b208 + (long)*(int *)&t[1].tail * 0x51,0x288);
    if ((*(byte *)(in_RSI + 0x124) & 1) != 0) {
      reset_film_grain_chroma_params((aom_film_grain_t *)0x2333b5);
    }
    *(undefined4 *)(num + 0x5f40) = *(undefined4 *)(*(long *)(num + 0x6088) + 0x48);
    if (*(int *)(*(long *)(num + 0x6088) + 0x5c) == 1) {
      num[0x5f3c] = '\0';
      num[0x5f3d] = '\0';
      num[0x5f3e] = '\0';
      num[0x5f3f] = '\0';
    }
  }
  return;
}

Assistant:

void av1_update_film_grain_parameters(struct AV1_COMP *cpi,
                                      const AV1EncoderConfig *oxcf) {
  AV1_COMMON *const cm = &cpi->common;
  const TuneCfg *const tune_cfg = &oxcf->tune_cfg;

  if (cpi->film_grain_table) {
    aom_film_grain_table_free(cpi->film_grain_table);
    aom_free(cpi->film_grain_table);
    cpi->film_grain_table = NULL;
  }

  if (tune_cfg->film_grain_test_vector) {
    if (cm->current_frame.frame_type == KEY_FRAME) {
      memcpy(&cm->film_grain_params,
             film_grain_test_vectors + tune_cfg->film_grain_test_vector - 1,
             sizeof(cm->film_grain_params));
      if (oxcf->tool_cfg.enable_monochrome)
        reset_film_grain_chroma_params(&cm->film_grain_params);
      cm->film_grain_params.bit_depth = cm->seq_params->bit_depth;
      if (cm->seq_params->color_range == AOM_CR_FULL_RANGE) {
        cm->film_grain_params.clip_to_restricted_range = 0;
      }
    }
  } else if (tune_cfg->film_grain_table_filename) {
    CHECK_MEM_ERROR(cm, cpi->film_grain_table,
                    aom_calloc(1, sizeof(*cpi->film_grain_table)));

    aom_film_grain_table_read(cpi->film_grain_table,
                              tune_cfg->film_grain_table_filename, cm->error);
  } else if (tune_cfg->content == AOM_CONTENT_FILM) {
    cm->film_grain_params.bit_depth = cm->seq_params->bit_depth;
    if (oxcf->tool_cfg.enable_monochrome)
      reset_film_grain_chroma_params(&cm->film_grain_params);
    if (cm->seq_params->color_range == AOM_CR_FULL_RANGE)
      cm->film_grain_params.clip_to_restricted_range = 0;
  } else {
    memset(&cm->film_grain_params, 0, sizeof(cm->film_grain_params));
  }
}